

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLimits.cpp
# Opt level: O0

void __thiscall
glcts::GeometryShaderMaxCombinedTextureUnitsTest::clean
          (GeometryShaderMaxCombinedTextureUnitsTest *this)

{
  code *pcVar1;
  int iVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  reference pvVar5;
  int local_20;
  int local_1c;
  int i_1;
  int i;
  Functions *gl;
  GeometryShaderMaxCombinedTextureUnitsTest *this_local;
  long lVar4;
  
  pRVar3 = deqp::Context::getRenderContext
                     ((this->super_GeometryShaderLimitsRenderingBase).super_TestCaseBase.m_context);
  iVar2 = (*pRVar3->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar2);
  for (local_1c = 0; local_1c < this->m_n_texture_units; local_1c = local_1c + 1) {
    (**(code **)(lVar4 + 8))(local_1c + 0x84c0);
    (**(code **)(lVar4 + 0xb8))(0xde1,0);
  }
  for (local_20 = 0; local_20 < this->m_n_texture_units; local_20 = local_20 + 1) {
    pcVar1 = *(code **)(lVar4 + 0x480);
    pvVar5 = std::
             vector<glcts::GeometryShaderMaxCombinedTextureUnitsTest::_texture_data,_std::allocator<glcts::GeometryShaderMaxCombinedTextureUnitsTest::_texture_data>_>
             ::operator[](&this->m_textures,(long)local_20);
    (*pcVar1)(1,pvVar5);
  }
  std::
  vector<glcts::GeometryShaderMaxCombinedTextureUnitsTest::_texture_data,_std::allocator<glcts::GeometryShaderMaxCombinedTextureUnitsTest::_texture_data>_>
  ::clear(&this->m_textures);
  return;
}

Assistant:

void GeometryShaderMaxCombinedTextureUnitsTest::clean()
{
	/* GL functions */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Bind 0 to all texture units */
	for (int i = 0; i < m_n_texture_units; ++i)
	{
		gl.activeTexture(GL_TEXTURE0 + i);
		gl.bindTexture(GL_TEXTURE_2D, 0);
	}

	/* Delete textures */
	for (int i = 0; i < m_n_texture_units; ++i)
	{
		gl.deleteTextures(1, &m_textures[i].texture_id);
	}

	m_textures.clear();
}